

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls.c
# Opt level: O1

void tlstran_ep_close(void *arg)

{
  void *pvVar1;
  
  nni_mtx_lock((nni_mtx *)arg);
  *(undefined1 *)((long)arg + 0x39) = 1;
  nni_aio_close((nni_aio *)((long)arg + 0x248));
  if (*(nng_stream_dialer **)((long)arg + 0x58) != (nng_stream_dialer *)0x0) {
    nng_stream_dialer_close(*(nng_stream_dialer **)((long)arg + 0x58));
  }
  if (*(nng_stream_listener **)((long)arg + 0x60) != (nng_stream_listener *)0x0) {
    nng_stream_listener_close(*(nng_stream_listener **)((long)arg + 0x60));
  }
  for (pvVar1 = nni_list_first((nni_list *)((long)arg + 0x428)); pvVar1 != (void *)0x0;
      pvVar1 = nni_list_next((nni_list *)((long)arg + 0x428),pvVar1)) {
    nni_pipe_close(*(nni_pipe **)((long)pvVar1 + 8));
  }
  for (pvVar1 = nni_list_first((nni_list *)((long)arg + 0x410)); pvVar1 != (void *)0x0;
      pvVar1 = nni_list_next((nni_list *)((long)arg + 0x410),pvVar1)) {
    nni_pipe_close(*(nni_pipe **)((long)pvVar1 + 8));
  }
  if (*(nni_aio **)((long)arg + 0x78) != (nni_aio *)0x0) {
    nni_aio_finish_error(*(nni_aio **)((long)arg + 0x78),NNG_ECLOSED);
    *(undefined8 *)((long)arg + 0x78) = 0;
  }
  nni_mtx_unlock((nni_mtx *)arg);
  return;
}

Assistant:

static void
tlstran_ep_close(void *arg)
{
	tlstran_ep   *ep = arg;
	tlstran_pipe *p;

	nni_mtx_lock(&ep->mtx);
	ep->closed = true;
	nni_aio_close(&ep->timeaio);

	if (ep->dialer != NULL) {
		nng_stream_dialer_close(ep->dialer);
	}
	if (ep->listener != NULL) {
		nng_stream_listener_close(ep->listener);
	}
	NNI_LIST_FOREACH (&ep->negopipes, p) {
		nni_pipe_close(p->npipe);
	}
	NNI_LIST_FOREACH (&ep->waitpipes, p) {
		nni_pipe_close(p->npipe);
	}
	if (ep->useraio != NULL) {
		nni_aio_finish_error(ep->useraio, NNG_ECLOSED);
		ep->useraio = NULL;
	}
	nni_mtx_unlock(&ep->mtx);
}